

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * HelpExampleRpcNamed(string *__return_storage_ptr__,string *methodname,RPCArgList *args)

{
  pointer ppVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string key;
  UniValue val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined8 uVar6;
  pointer ppVar7;
  long in_FS_OFFSET;
  UniValue params;
  _Alloc_hider in_stack_fffffffffffffe58;
  _Alloc_hider in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  pointer in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  _Alloc_hider in_stack_fffffffffffffe98;
  _Alloc_hider __s;
  pointer in_stack_fffffffffffffea0;
  pointer __n2;
  undefined8 in_stack_fffffffffffffea8;
  undefined8 uVar8;
  undefined8 in_stack_fffffffffffffeb0;
  _Alloc_hider in_stack_fffffffffffffeb8;
  _Alloc_hider _Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  VType local_128;
  long *local_120 [2];
  long local_110 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  vector<UniValue,_std::allocator<UniValue>_> local_e8;
  long *local_d0 [2];
  long local_c0 [2];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  UniValue local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0 = local_a0;
  local_a8 = 0;
  local_90.val._M_dataplus._M_p = (pointer)&local_90.val.field_2;
  local_90.typ = VOBJ;
  local_90.val.field_2._M_local_buf[0] = '\0';
  local_90.val.field_2._M_allocated_capacity._1_7_ = (undefined7)local_a0._1_8_;
  local_90.val.field_2._M_local_buf[8] = SUB81(local_a0._1_8_,7);
  local_90.val._M_string_length = 0;
  local_a0[0] = 0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar7 = (args->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (args->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar7 != ppVar1) {
    do {
      local_d0[0] = local_c0;
      pcVar2 = (ppVar7->first)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_d0,pcVar2,pcVar2 + (ppVar7->first)._M_string_length);
      local_128 = (ppVar7->second).typ;
      pcVar2 = (ppVar7->second).val._M_dataplus._M_p;
      local_120[0] = local_110;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_120,pcVar2,pcVar2 + (ppVar7->second).val._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_100,&(ppVar7->second).keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_e8,&(ppVar7->second).values);
      key._M_string_length = (size_type)methodname;
      key._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      key.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe58._M_p;
      key.field_2._8_8_ = in_stack_fffffffffffffe60._M_p;
      val.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe70;
      val._0_8_ = in_stack_fffffffffffffe68;
      val.val._M_string_length = in_stack_fffffffffffffe78;
      val.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe80;
      val.val.field_2._8_8_ = in_stack_fffffffffffffe88;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe90;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe98._M_p;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffea0;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffea8;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffeb0;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffeb8._M_p;
      UniValue::pushKV(&local_90,key,val);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_100);
      if (local_120[0] != local_110) {
        operator_delete(local_120[0],local_110[0] + 1);
      }
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0],local_c0[0] + 1);
      }
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 != ppVar1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffe78,
                 "> curl --user myusername --data-binary \'{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \""
                 ,methodname);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffe78,"\", \"params\": ");
  __s._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__s._M_p == paVar5) {
    uVar8 = paVar5->_M_allocated_capacity;
    __s._M_p = (pointer)&stack0xfffffffffffffea8;
  }
  else {
    uVar8 = paVar5->_M_allocated_capacity;
  }
  __n2 = (pointer)pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  UniValue::write_abi_cxx11_((UniValue *)&stack0xfffffffffffffe58,(int)&local_90,(void *)0x0,0);
  uVar6 = (pointer)0xf;
  if ((pointer)__s._M_p != (pointer)&stack0xfffffffffffffea8) {
    uVar6 = uVar8;
  }
  if ((ulong)uVar6 < (pointer)(in_stack_fffffffffffffe60._M_p + (long)__n2)) {
    uVar6 = (pointer)0xf;
    if (in_stack_fffffffffffffe58._M_p != &stack0xfffffffffffffe68) {
      uVar6 = in_stack_fffffffffffffe68;
    }
    if ((pointer)(in_stack_fffffffffffffe60._M_p + (long)__n2) <= (ulong)uVar6) {
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffe58,0,0,__s._M_p,(size_type)__n2);
      goto LAB_003794b1;
    }
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffe98,in_stack_fffffffffffffe58._M_p,
                     (size_type)in_stack_fffffffffffffe60._M_p);
LAB_003794b1:
  _Var9._M_p = (pointer)&local_138;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if (paVar3 == paVar5) {
    local_138._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_138._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_138._M_allocated_capacity = paVar5->_M_allocated_capacity;
    _Var9._M_p = (pointer)paVar3;
  }
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffeb8,
                      "}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\n");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar5) {
    uVar6 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var9._M_p != &local_138) {
    operator_delete(_Var9._M_p,local_138._M_allocated_capacity + 1);
  }
  if (in_stack_fffffffffffffe58._M_p != &stack0xfffffffffffffe68) {
    operator_delete(in_stack_fffffffffffffe58._M_p,(ulong)(in_stack_fffffffffffffe68 + 1));
  }
  if ((pointer)__s._M_p != (pointer)&stack0xfffffffffffffea8) {
    operator_delete(__s._M_p,(ulong)(uVar8 + 1));
  }
  if ((undefined1 *)in_stack_fffffffffffffe78 != &stack0xfffffffffffffe88) {
    operator_delete((void *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe88 + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p != &local_90.val.field_2) {
    operator_delete(local_90.val._M_dataplus._M_p,
                    CONCAT71(local_90.val.field_2._M_allocated_capacity._1_7_,
                             local_90.val.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string HelpExampleRpcNamed(const std::string& methodname, const RPCArgList& args)
{
    UniValue params(UniValue::VOBJ);
    for (const auto& param: args) {
        params.pushKV(param.first, param.second);
    }

    return "> curl --user myusername --data-binary '{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", "
           "\"method\": \"" + methodname + "\", \"params\": " + params.write() + "}' -H 'content-type: application/json' http://127.0.0.1:8332/\n";
}